

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O3

void __thiscall PathTest::AppendTest(PathTest *this)

{
  int iVar1;
  long lVar2;
  Path p;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  lVar2 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,*(char **)((long)&appendTestData[0].path1 + lVar2),&local_51);
    JetHead::Path::append((Path *)local_50,*(char **)((long)&appendTestData[0].path2 + lVar2));
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 != 0) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xe9,"Append of %s and %s failed (%s)",
                 *(undefined8 *)((long)&appendTestData[0].path1 + lVar2),
                 *(undefined8 *)((long)&appendTestData[0].path2 + lVar2),local_50[0]);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  return;
}

Assistant:

void PathTest::AppendTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( appendTestData ); i++ )
	{
		Path p = appendTestData[ i ].path1;
		p.append( appendTestData[ i ].path2 );
		if ( p != appendTestData[ i ].result )
		{
			TestFailed( "Append of %s and %s failed (%s)", 
				appendTestData[ i ].path1, 
				appendTestData[ i ].path2, 
				p.getString().c_str() );
		}
	}
}